

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

int doinvoke(obj *obj)

{
  boolean bVar1;
  int iVar2;
  obj *local_18;
  obj *obj_local;
  
  if ((obj != (obj *)0x0) &&
     (bVar1 = validate_object(obj,"\x14","invoke, break, or rub"), bVar1 == '\0')) {
    return 0;
  }
  local_18 = obj;
  if (obj == (obj *)0x0) {
    local_18 = getobj("\x14","invoke, break, or rub",(obj **)0x0);
  }
  if (local_18 == (obj *)0x0) {
    obj_local._4_4_ = 0;
  }
  else {
    if ((local_18->oartifact != '\0') && (iVar2 = touch_artifact(local_18,&youmonst), iVar2 == 0)) {
      return 1;
    }
    obj_local._4_4_ = arti_invoke(local_18);
  }
  return obj_local._4_4_;
}

Assistant:

int doinvoke(struct obj *obj)
{
    if (obj && !validate_object(obj, invoke_types, "invoke, break, or rub"))
	return 0;
    else if (!obj)
	obj = getobj(invoke_types, "invoke, break, or rub", NULL);
    if (!obj) return 0;
    
    if (obj->oartifact && !touch_artifact(obj, &youmonst))
	return 1;
    return arti_invoke(obj);
}